

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  vec<2U,_float> *pvVar4;
  VectorInfo *pVVar5;
  bool *pbVar6;
  bool bVar7;
  uint uVar8;
  distance_comparison_task_params *pParams;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  float dist2;
  float fVar13;
  float dist2_1;
  float fVar14;
  float fVar15;
  
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  uVar11 = (ulong)(uint)(*(int *)((long)pData_ptr + 0x14) - iVar1);
  uVar10 = (int)((uVar11 * data) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  uVar8 = (int)(((data + 1) * uVar11) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  if (uVar10 < uVar8) {
    lVar2 = *pData_ptr;
    lVar3 = *(long *)((long)pData_ptr + 8);
    pvVar4 = this->m_vectors;
    pVVar5 = (this->m_vectorsInfo).m_p;
    pbVar6 = (this->m_vectorComparison).m_p;
    uVar11 = (ulong)uVar10;
    do {
      uVar10 = pVVar5[uVar11].index;
      fVar13 = 0.0;
      lVar9 = 0;
      bVar7 = true;
      do {
        bVar12 = bVar7;
        fVar14 = *(float *)(lVar2 + lVar9 * 4) - pvVar4[uVar10].m_s[lVar9];
        fVar13 = fVar13 + fVar14 * fVar14;
        lVar9 = 1;
        bVar7 = false;
      } while (bVar12);
      fVar14 = 0.0;
      lVar9 = 0;
      bVar7 = true;
      do {
        bVar12 = bVar7;
        fVar15 = *(float *)(lVar3 + lVar9 * 4) - pvVar4[uVar10].m_s[lVar9];
        fVar14 = fVar14 + fVar15 * fVar15;
        lVar9 = 1;
        bVar7 = false;
      } while (bVar12);
      pbVar6[uVar11] = fVar13 < fVar14;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar8);
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr)
        {
            distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
            const VectorType& left_child = *pParams->left_child;
            const VectorType& right_child = *pParams->right_child;
            uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
            uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
            for (uint i = begin; i < end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                m_vectorComparison[i] = left_dist2 < right_dist2;
            }
        }